

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

int xmlCopyError(xmlErrorPtr from,xmlErrorPtr to)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  
  iVar1 = -1;
  if (to != (xmlErrorPtr)0x0 && from != (xmlErrorPtr)0x0) {
    pxVar2 = xmlStrdup((xmlChar *)from->message);
    pxVar3 = xmlStrdup((xmlChar *)from->file);
    pxVar4 = xmlStrdup((xmlChar *)from->str1);
    pxVar5 = xmlStrdup((xmlChar *)from->str2);
    pxVar6 = xmlStrdup((xmlChar *)from->str3);
    if (to->message != (char *)0x0) {
      (*xmlFree)(to->message);
    }
    if (to->file != (char *)0x0) {
      (*xmlFree)(to->file);
    }
    if (to->str1 != (char *)0x0) {
      (*xmlFree)(to->str1);
    }
    if (to->str2 != (char *)0x0) {
      (*xmlFree)(to->str2);
    }
    if (to->str3 != (char *)0x0) {
      (*xmlFree)(to->str3);
    }
    to->domain = from->domain;
    to->code = from->code;
    to->level = from->level;
    to->line = from->line;
    to->node = from->node;
    to->int1 = from->int1;
    to->int2 = from->int2;
    to->node = from->node;
    to->ctxt = from->ctxt;
    to->message = (char *)pxVar2;
    to->file = (char *)pxVar3;
    to->str1 = (char *)pxVar4;
    to->str2 = (char *)pxVar5;
    to->str3 = (char *)pxVar6;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlCopyError(xmlErrorPtr from, xmlErrorPtr to) {
    char *message, *file, *str1, *str2, *str3;

    if ((from == NULL) || (to == NULL))
        return(-1);

    message = (char *) xmlStrdup((xmlChar *) from->message);
    file = (char *) xmlStrdup ((xmlChar *) from->file);
    str1 = (char *) xmlStrdup ((xmlChar *) from->str1);
    str2 = (char *) xmlStrdup ((xmlChar *) from->str2);
    str3 = (char *) xmlStrdup ((xmlChar *) from->str3);

    if (to->message != NULL)
        xmlFree(to->message);
    if (to->file != NULL)
        xmlFree(to->file);
    if (to->str1 != NULL)
        xmlFree(to->str1);
    if (to->str2 != NULL)
        xmlFree(to->str2);
    if (to->str3 != NULL)
        xmlFree(to->str3);
    to->domain = from->domain;
    to->code = from->code;
    to->level = from->level;
    to->line = from->line;
    to->node = from->node;
    to->int1 = from->int1;
    to->int2 = from->int2;
    to->node = from->node;
    to->ctxt = from->ctxt;
    to->message = message;
    to->file = file;
    to->str1 = str1;
    to->str2 = str2;
    to->str3 = str3;

    return 0;
}